

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

int __thiscall
ON_TextureMapping::EvaluateSphereMapping
          (ON_TextureMapping *this,ON_3dPoint *P,ON_3dVector *N,ON_3dPoint *T)

{
  int iVar1;
  ulong uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  double dVar6;
  ON_3dPoint rst;
  double t0;
  double t1;
  ON_3dVector n;
  ON_3dPoint local_b8;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  ON_3dVector local_70;
  ON_3dVector local_58;
  ON_3dPoint local_40;
  
  ON_Xform::operator*(&local_b8,&this->m_Pxyz,P);
  local_80 = ON_3dVector::Length((ON_3dVector *)&local_b8);
  if (this->m_projection == ray_projection) {
    ON_Xform::operator*(&local_70,&this->m_Nxyz,N);
    dVar6 = local_70.z * local_b8.z + local_70.x * local_b8.x + local_70.y * local_b8.y;
    iVar1 = ON_SolveQuadraticEquation
                      (local_70.z * local_70.z + local_70.x * local_70.x + local_70.y * local_70.y,
                       dVar6 + dVar6,
                       local_b8.z * local_b8.z + local_b8.x * local_b8.x + local_b8.y * local_b8.y +
                       -1.0,&local_98,&local_78);
    if (-1 < iVar1) {
      uVar3 = SUB84(local_98,0);
      uVar4 = (undefined4)((ulong)local_98 >> 0x20);
      if ((iVar1 != 2) &&
         ((local_98 < 0.0 && local_98 < local_78 || (0.0 <= local_78 && local_78 < local_98)))) {
        local_98 = local_78;
        uVar3 = SUB84(local_78,0);
        uVar4 = (undefined4)((ulong)local_78 >> 0x20);
      }
      ::operator*(&local_58,(double)CONCAT44(uVar4,uVar3),&local_70);
      ON_3dPoint::operator+(&local_40,&local_b8,&local_58);
      local_b8.z = local_40.z;
      local_b8.x = local_40.x;
      local_b8.y = local_40.y;
    }
  }
  dVar6 = 0.0;
  if ((((local_b8.y != 0.0) || (NAN(local_b8.y))) || (local_b8.x != 0.0)) || (NAN(local_b8.x))) {
    dVar6 = atan2(local_b8.y,local_b8.x);
    dVar6 = dVar6 * 0.5;
  }
  uVar3 = 0;
  uVar4 = 0;
  if ((local_b8.z != 0.0) || (NAN(local_b8.z))) {
    local_90 = local_b8.z;
    local_88 = dVar6;
    dVar6 = ON_2dVector::Length((ON_2dVector *)&local_b8);
    dVar6 = atan2(local_90,dVar6);
    uVar3 = SUB84(dVar6,0);
    uVar4 = (undefined4)((ulong)dVar6 >> 0x20);
    dVar6 = local_88;
  }
  local_b8.x = dVar6 / 3.141592653589793;
  uVar2 = -(ulong)(3.141592653589793 < (double)CONCAT44(uVar4,uVar3));
  if (-2.220446049250313e-16 <= local_b8.x) {
    if (0.0 <= local_b8.x) {
      if (1.0 < local_b8.x) {
        local_b8.x = 1.0;
      }
    }
    else {
      local_b8.x = 0.0;
    }
  }
  else {
    local_b8.x = local_b8.x + 1.0;
  }
  local_b8.y = (double)(~uVar2 & CONCAT44(uVar4,uVar3) |
                       (ulong)((double)CONCAT44(uVar4,uVar3) + -6.283185307179586) & uVar2) /
               3.141592653589793 + 0.5;
  uVar5 = 0;
  if ((local_b8.y <= 0.0) || (uVar5 = 0x3ff00000, 1.0 < local_b8.y)) {
    local_b8.y = (double)((ulong)uVar5 << 0x20);
  }
  local_b8.z = local_80;
  ON_Xform::operator*((ON_3dPoint *)&local_70,&this->m_uvw,&local_b8);
  T->z = local_70.z;
  T->x = local_70.x;
  T->y = local_70.y;
  return 1;
}

Assistant:

int ON_TextureMapping::EvaluateSphereMapping(
											  const ON_3dPoint& P,
											  const ON_3dVector& N,
											  ON_3dPoint* T
											  ) const
{
  // The matrix m_Pxyz transforms the world coordinate
  // "mapping sphere" into the sphere centered at
  // rst = (0,0,0) with radius 1.0.

  ON_3dPoint rst(m_Pxyz*P);
	const double r = ((const ON_3dVector*)(&rst.x))->Length();
	double t0, t1;

	if ( ON_TextureMapping::PROJECTION::ray_projection == m_projection )
	{
		ON_3dVector n(m_Nxyz*N);
		// Shoot a ray from P in the direction N and see if it
		// hits the sphere.
		int rc = ON_SolveQuadraticEquation( (n.x*n.x+n.y*n.y+n.z*n.z),
			2.0*(rst.x*n.x+rst.y*n.y+rst.z*n.z),
			(rst.x*rst.x+rst.y*rst.y+rst.z*rst.z) - 1.0,
			&t0, &t1 );
		if (rc >= 0 )
		{
			if ( 2 != rc && 1 == BestHitHelper(t0,t1) )
			{
				t0 = t1;
			}
			rst = rst + t0*n;
		}
	}

	// convert sphere 3d location to longitude, latitude, radius
	double longitude = (0.0 != rst.y || 0.0 != rst.x)
		? atan2(rst.y,rst.x)
		: 0.0;
	double latitude = (0.0 != rst.z)
		? atan2(rst.z,((const ON_2dVector*)(&rst.x))->Length())
		: 0.0;
	if ( latitude > ON_PI )
		latitude -= 2.0*ON_PI;

  // convert longitude to normalized texture coordinate
	rst.x = 0.5*longitude/ON_PI;
	if ( rst.x < -ON_EPSILON )
		rst.x += 1.0;
	else if (rst.x < 0.0)
		rst.x = 0.0;
	else if (rst.x > 1.0)
		rst.x = 1.0;

  // convert longitude to normalized texture coordinate
	rst.y = latitude/ON_PI + 0.5;
  if ( rst.y <= 0.0 )
    rst.y = 0.0;
	else if ( rst.y > 1.0 )
		  rst.y = 1.0;

  // radius is already normalized
	rst.z = r;

  // apply texture coordinate transformation
	*T = m_uvw*rst;

  return 1;
}